

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckHeader.cxx
# Opt level: O2

bool __thiscall
kws::Parser::CheckHeader(Parser *this,char *filename,bool considerSpaceEOL,bool useCVS)

{
  string *psVar1;
  bool bVar2;
  char cVar3;
  __type _Var4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  Status SVar9;
  size_t sVar10;
  unsigned_long uVar11;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  pointer pcVar15;
  long lVar16;
  long lVar17;
  ostream *poVar18;
  size_type sVar19;
  char *pcVar20;
  char *pcVar21;
  uint uVar22;
  unsigned_long j;
  uint uVar23;
  char cVar24;
  pointer pvVar25;
  int iVar26;
  char *pcVar27;
  _Alloc_hider _Var28;
  pointer pbVar29;
  pointer pcVar30;
  pointer __x;
  value_type *__x_00;
  bool bVar31;
  string fullpath;
  Directory directory;
  string file;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  string *local_328;
  string wordh;
  string word;
  string headerFilename;
  ErrorVectorType tempErrorVector;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fileNames;
  vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
  tempErrors;
  string dirname;
  
  this->m_TestsDone[0xd] = true;
  pcVar7 = (char *)operator_new__(0xff);
  builtin_strncpy(pcVar7,"The header should respect the template",0x27);
  std::__cxx11::string::assign((char *)(this->m_TestsDescription + 0xd));
  operator_delete__(pcVar7);
  if (filename == (char *)0x0) {
    poVar18 = std::operator<<((ostream *)&std::cout,
                              "CheckHeader(): Please specify an header file or a directory containing headers"
                             );
    std::endl<char,std::char_traits<char>>(poVar18);
    return false;
  }
  fileNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fileNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fileNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&headerFilename,filename,(allocator *)&dirname);
  lVar8 = std::__cxx11::string::find((char)&headerFilename,0x20);
  if (lVar8 == -1) {
    std::__cxx11::string::assign((char *)&headerFilename);
    for (uVar13 = 0; sVar10 = strlen(filename), uVar13 < sVar10; uVar13 = uVar13 + 1) {
      if (filename[uVar13] != '\"') {
        std::__cxx11::string::push_back((char)&headerFilename);
      }
    }
  }
  if (*headerFilename._M_dataplus._M_p == '\"') {
    std::__cxx11::string::substr((ulong)&dirname,(ulong)&headerFilename);
    std::__cxx11::string::operator=((string *)&headerFilename,(string *)&dirname);
    std::__cxx11::string::~string((string *)&dirname);
  }
  kwssys::Directory::Directory(&directory);
  std::__cxx11::string::string
            ((string *)&dirname,headerFilename._M_dataplus._M_p,(allocator *)&file);
  SVar9 = kwssys::Directory::Load(&directory,&dirname,(string *)0x0);
  std::__cxx11::string::~string((string *)&dirname);
  if (SVar9.Kind_ == Success) {
    std::__cxx11::string::string((string *)&dirname,(string *)&headerFilename);
    if (dirname._M_dataplus._M_p[dirname._M_string_length - 1] != '/') {
      std::__cxx11::string::append((char *)&dirname);
    }
    uVar22 = 0;
    while( true ) {
      uVar11 = kwssys::Directory::GetNumberOfFiles(&directory);
      if (uVar11 <= uVar22) break;
      pcVar7 = kwssys::Directory::GetFile(&directory,(ulong)uVar22);
      std::__cxx11::string::string((string *)&file,pcVar7,(allocator *)&fullpath);
      std::operator+(&fullpath,&dirname,&file);
      bVar2 = std::operator!=(&file,"..");
      if ((((bVar2) && (bVar2 = std::operator!=(&file,"."), bVar2)) &&
          (bVar2 = std::operator!=(&file,"CVS"), bVar2)) &&
         (bVar2 = std::operator!=(&file,".svn"), bVar2)) {
        std::operator+(&wordh,&dirname,&file);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&fileNames,
                   &wordh);
        std::__cxx11::string::~string((string *)&wordh);
      }
      std::__cxx11::string::~string((string *)&fullpath);
      std::__cxx11::string::~string((string *)&file);
      uVar22 = uVar22 + 1;
    }
    std::__cxx11::string::~string((string *)&dirname);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&fileNames,&headerFilename);
  }
  tempErrors.
  super__Vector_base<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tempErrors.
  super__Vector_base<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tempErrors.
  super__Vector_base<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_328 = &this->m_Buffer;
  bVar5 = false;
  pbVar29 = fileNames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  bVar2 = !useCVS;
  while (pbVar29 !=
         fileNames.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
    std::ifstream::ifstream(&dirname);
    std::ifstream::open((char *)&dirname,(_Ios_Openmode)(pbVar29->_M_dataplus)._M_p);
    cVar3 = std::__basic_file<char>::is_open();
    if (cVar3 != '\0') {
      std::istream::seekg((long)&dirname,_S_beg);
      lVar8 = std::istream::tellg();
      std::istream::seekg((long)&dirname,_S_beg);
      pcVar7 = (char *)operator_new__(lVar8 + 1);
      std::istream::read((char *)&dirname,(long)pcVar7);
      pcVar7[lVar8] = '\0';
      std::__cxx11::string::string((string *)&fullpath,pcVar7,(allocator *)&file);
      std::__cxx11::string::resize((ulong)&fullpath);
      std::ifstream::close();
      operator_delete__(pcVar7);
      ConvertBufferToWindowsFileType(this,&fullpath);
      tempErrorVector.super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      tempErrorVector.super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      tempErrorVector.super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pcVar7 = (this->m_Buffer)._M_dataplus._M_p;
      sVar19 = (this->m_Buffer)._M_string_length;
      uVar22 = 0;
      pcVar30 = (pointer)0xffffffffffffffff;
      uVar23 = 0;
      bVar5 = false;
      pcVar27 = pcVar7;
      _Var28 = fullpath._M_dataplus;
LAB_0013ce53:
      do {
        pcVar7 = pcVar7 + sVar19;
        pcVar12 = fullpath._M_dataplus._M_p + fullpath._M_string_length;
LAB_0013ce59:
        if ((_Var28._M_p == pcVar12) || (pcVar27 == pcVar7)) {
          if (pcVar27 == pcVar7) {
            file.field_2._8_8_ = &local_338;
            local_338._M_local_buf[0] = '\0';
            file._M_dataplus._M_p = (pointer)0x1;
            file._M_string_length = 1;
            file.field_2._M_allocated_capacity = 0xd;
            std::__cxx11::string::assign(file.field_2._M_local_buf + 8);
            std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                      (&tempErrorVector,(value_type *)&file);
            std::__cxx11::string::~string((string *)(file.field_2._M_local_buf + 8));
            bVar5 = true;
LAB_0013d5b4:
            std::
            vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
            ::push_back(&tempErrors,&tempErrorVector);
            pbVar29 = pbVar29 + 1;
            bVar31 = true;
          }
          else {
            if (bVar5) goto LAB_0013d5b4;
            std::__cxx11::string::_M_assign((string *)&this->m_HeaderFilename);
            for (__x = tempErrorVector.
                       super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
                       _M_impl.super__Vector_impl_data._M_start;
                __x != tempErrorVector.
                       super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
                       _M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
              std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                        (&this->m_ErrorList,__x);
            }
            bVar2 = true;
            bVar31 = false;
          }
          std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::~vector
                    (&tempErrorVector);
          std::__cxx11::string::~string((string *)&fullpath);
          goto LAB_0013d5f0;
        }
        cVar3 = *_Var28._M_p;
        if (cVar3 != '$' || !useCVS) {
          cVar24 = *pcVar27;
        }
        else {
          do {
            _Var28._M_p = _Var28._M_p + 1;
            uVar22 = uVar22 + 1;
            cVar3 = *_Var28._M_p;
            if (_Var28._M_p == pcVar12) break;
          } while (cVar3 != '$');
          do {
            pcVar27 = pcVar27 + 1;
            uVar23 = uVar23 + 1;
            cVar24 = *pcVar27;
            if (pcVar27 == pcVar7) break;
          } while (cVar24 != '$');
        }
        if (cVar24 == cVar3) goto LAB_0013d3ed;
        if (cVar3 != '<') {
          if (!considerSpaceEOL) {
            pcVar21 = pcVar27;
            if (cVar3 == ' ') {
              pcVar20 = _Var28._M_p;
              if (cVar24 == ' ') goto LAB_0013cf10;
              while( true ) {
                if (pcVar20 == pcVar12) goto LAB_0013cfe7;
                cVar3 = *pcVar20;
                if (cVar3 != ' ') break;
                pcVar20 = pcVar20 + 1;
              }
            }
            else {
              if (cVar24 != ' ') goto LAB_0013cfe7;
LAB_0013cf10:
              while( true ) {
                if (pcVar21 == pcVar7) goto LAB_0013cfe7;
                cVar3 = *pcVar21;
                if (cVar3 != ' ') break;
                pcVar21 = pcVar21 + 1;
              }
            }
            if (cVar3 != '\n') goto LAB_0013cf2f;
          }
          goto LAB_0013cfe7;
        }
        uVar13 = std::__cxx11::string::find((char *)&fullpath,0x1621ab);
        uVar14 = std::__cxx11::string::find((char *)&fullpath,0x1621b0);
        if (uVar14 != uVar22) {
          if (uVar13 != uVar22) goto LAB_0013cfe7;
          for (; (*_Var28._M_p != ' ' &&
                 (_Var28._M_p != fullpath._M_dataplus._M_p + fullpath._M_string_length));
              _Var28._M_p = _Var28._M_p + 1) {
            uVar22 = uVar22 + 1;
          }
          pcVar7 = (this->m_Buffer)._M_dataplus._M_p;
          sVar19 = (this->m_Buffer)._M_string_length;
          for (; (*pcVar27 != ' ' && (pcVar27 != pcVar7 + sVar19)); pcVar27 = pcVar27 + 1) {
            uVar23 = uVar23 + 1;
          }
          goto LAB_0013ce53;
        }
        for (; (*_Var28._M_p != '\n' &&
               (_Var28._M_p != fullpath._M_dataplus._M_p + fullpath._M_string_length));
            _Var28._M_p = _Var28._M_p + 1) {
          uVar22 = uVar22 + 1;
        }
        pcVar7 = (this->m_Buffer)._M_dataplus._M_p;
        sVar19 = (this->m_Buffer)._M_string_length;
        for (; (*pcVar27 != '\n' && (pcVar27 != pcVar7 + sVar19)); pcVar27 = pcVar27 + 1) {
          uVar23 = uVar23 + 1;
        }
      } while( true );
    }
    poVar18 = std::operator<<((ostream *)&std::cout,"Cannot open header file: ");
    poVar18 = std::operator<<(poVar18,(pbVar29->_M_dataplus)._M_p);
    bVar31 = false;
    std::endl<char,std::char_traits<char>>(poVar18);
    bVar5 = false;
    bVar2 = false;
LAB_0013d5f0:
    std::ifstream::~ifstream(&dirname);
    if (!bVar31) goto LAB_0013d6a2;
  }
  iVar26 = 9999999;
  uVar22 = 0;
  uVar23 = 0;
  for (pvVar25 = tempErrors.
                 super__Vector_base<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pvVar25 !=
      tempErrors.
      super__Vector_base<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; pvVar25 = pvVar25 + 1) {
    iVar6 = (int)(((long)(pvVar25->
                         super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(pvVar25->
                        super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>).
                        _M_impl.super__Vector_impl_data._M_start) / 0x38);
    if (iVar6 < iVar26) {
      uVar22 = uVar23;
    }
    if (iVar26 < iVar6) {
      iVar6 = iVar26;
    }
    iVar26 = iVar6;
    uVar23 = uVar23 + 1;
  }
  for (__x_00 = tempErrors.
                super__Vector_base<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar22].
                super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>._M_impl.
                super__Vector_impl_data._M_start;
      __x_00 != tempErrors.
                super__Vector_base<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar22].
                super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>._M_impl.
                super__Vector_impl_data._M_finish; __x_00 = __x_00 + 1) {
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
              (&this->m_ErrorList,__x_00);
  }
  std::__cxx11::string::_M_assign((string *)&this->m_HeaderFilename);
  bVar2 = (bool)(bVar5 ^ 1);
LAB_0013d6a2:
  std::
  vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
  ::~vector(&tempErrors);
  kwssys::Directory::~Directory(&directory);
  std::__cxx11::string::~string((string *)&headerFilename);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&fileNames);
  return bVar2;
LAB_0013cf2f:
  for (; (_Var28._M_p != pcVar12 && (*_Var28._M_p != '\n')); _Var28._M_p = _Var28._M_p + 1) {
    uVar22 = uVar22 + 1;
  }
  for (; (pcVar27 != pcVar7 && (*pcVar27 != '\n')); pcVar27 = pcVar27 + 1) {
    uVar23 = uVar23 + 1;
  }
  goto LAB_0013ce59;
LAB_0013cfe7:
  pcVar15 = (pointer)GetLineNumber(this,(ulong)uVar23,false);
  if (pcVar15 == pcVar30) goto LAB_0013d3ed;
  lVar8 = std::__cxx11::string::find((char)&fullpath,0x20);
  lVar16 = std::__cxx11::string::find((char)&fullpath,10);
  std::__cxx11::string::string((string *)&wordh,"",(allocator *)&file);
  if (lVar8 < lVar16 && lVar8 != -1) {
    std::__cxx11::string::substr((ulong)&file,(ulong)&fullpath);
    std::__cxx11::string::operator=((string *)&wordh,(string *)&file);
LAB_0013d0da:
    std::__cxx11::string::~string((string *)&file);
  }
  else if (lVar16 != -1) {
    std::__cxx11::string::substr((ulong)&file,(ulong)&fullpath);
    std::__cxx11::string::operator=((string *)&wordh,(string *)&file);
    goto LAB_0013d0da;
  }
  cVar3 = (char)local_328;
  lVar8 = std::__cxx11::string::find(cVar3,0x20);
  lVar17 = std::__cxx11::string::find(cVar3,10);
  std::__cxx11::string::string((string *)&word,"",(allocator *)&file);
  if (lVar8 < lVar17 && lVar8 != -1) {
    std::__cxx11::string::substr((ulong)&file,(ulong)local_328);
LAB_0013d1aa:
    std::__cxx11::string::operator=((string *)&word,(string *)&file);
    std::__cxx11::string::~string((string *)&file);
  }
  else if (lVar16 != -1) {
    std::__cxx11::string::substr((ulong)&file,(ulong)local_328);
    goto LAB_0013d1aa;
  }
  _Var4 = std::operator==(&word,&wordh);
  if (_Var4) {
    std::__cxx11::string::assign((char *)&wordh);
  }
  bVar5 = std::operator==(&word," ");
  if (bVar5) {
    std::__cxx11::string::assign((char *)&word);
  }
  bVar5 = std::operator==(&wordh," ");
  if (bVar5) {
    std::__cxx11::string::assign((char *)&wordh);
  }
  bVar5 = std::operator==(&word,"\r");
  if (bVar5) {
    std::__cxx11::string::assign((char *)&word);
  }
  bVar5 = std::operator==(&wordh,"\r");
  if (bVar5) {
    std::__cxx11::string::assign((char *)&wordh);
  }
  if (*word._M_dataplus._M_p == '\0') {
    std::__cxx11::string::assign((char *)&word);
  }
  if (*wordh._M_dataplus._M_p == '\0') {
    std::__cxx11::string::assign((char *)&wordh);
  }
  file.field_2._8_8_ = &local_338;
  local_338._M_local_buf[0] = '\0';
  file.field_2._M_allocated_capacity = 0xd;
  psVar1 = (string *)(file.field_2._M_local_buf + 8);
  file._M_dataplus._M_p = pcVar15;
  file._M_string_length = (size_type)pcVar15;
  std::__cxx11::string::assign((char *)psVar1);
  std::__cxx11::string::append(psVar1);
  std::__cxx11::string::append((char *)psVar1);
  std::__cxx11::string::append(psVar1);
  std::__cxx11::string::append((char *)psVar1);
  std::__cxx11::string::append((char *)psVar1);
  std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
            (&tempErrorVector,(value_type *)&file);
  for (; (_Var28._M_p != fullpath._M_dataplus._M_p + fullpath._M_string_length &&
         (*_Var28._M_p != '\n')); _Var28._M_p = _Var28._M_p + 1) {
    uVar22 = uVar22 + 1;
  }
  for (; (pcVar27 != (this->m_Buffer)._M_dataplus._M_p + (this->m_Buffer)._M_string_length &&
         (*pcVar27 != '\n')); pcVar27 = pcVar27 + 1) {
    uVar23 = uVar23 + 1;
  }
  std::__cxx11::string::~string((string *)(file.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&word);
  std::__cxx11::string::~string((string *)&wordh);
  bVar5 = true;
  pcVar30 = pcVar15;
LAB_0013d3ed:
  bVar31 = _Var28._M_p != fullpath._M_dataplus._M_p + fullpath._M_string_length;
  _Var28._M_p = _Var28._M_p + bVar31;
  uVar22 = uVar22 + bVar31;
  pcVar7 = (this->m_Buffer)._M_dataplus._M_p;
  sVar19 = (this->m_Buffer)._M_string_length;
  bVar31 = pcVar27 != pcVar7 + sVar19;
  pcVar27 = pcVar27 + bVar31;
  uVar23 = uVar23 + bVar31;
  goto LAB_0013ce53;
}

Assistant:

bool Parser::CheckHeader(const char* filename, bool considerSpaceEOL,bool useCVS)
{
  m_TestsDone[HEADER] = true;
  constexpr size_t length = 255;
  char* val = new char[length];
  snprintf(val,length,"The header should respect the template");
  m_TestsDescription[HEADER] = val;
  delete [] val;

  bool hasError = false;
  if(!filename)
    {
    std::cout << "CheckHeader(): Please specify an header file or a directory containing headers" << std::endl;
    return false;
    }

  std::vector<std::string> fileNames;
  
  // if there is no space in the name (i.e on linux) we remove the
  // '"' if any. 
  std::string headerFilename = filename;
  if(headerFilename.find(' ') == std::string::npos)
    {
    headerFilename = "";
    for(unsigned long j=0;j<strlen(filename);j++)
      {
      if(filename[j] != '\"')
        {
        headerFilename+=filename[j];
        }
      }
    }

  // Remove quotes if any on linux
  #ifndef WIN32
    if(headerFilename[0] == '"')
      {
      headerFilename = headerFilename.substr(1,headerFilename.size()-2);
      }
  #endif

  // Check if we have a directory or header
  kwssys::Directory directory;
  if(directory.Load(headerFilename.c_str()))
    {
    std::string dirname = headerFilename;
    if(dirname[dirname.size()-1] != '/')
      {
      dirname += "/";
      }

    for(unsigned int i=0;i<directory.GetNumberOfFiles();i++)
      {
      std::string file = directory.GetFile(i);
      std::string fullpath = dirname+file;
      
      if(file!=".." && file!="." && file!="CVS"&& file!= ".svn")
        {
        fileNames.push_back(dirname+file);
        }
      }
    }
  else
    {
    fileNames.push_back(headerFilename);
    }

  // Create a temporary vector of errors
  std::vector<ErrorVectorType> tempErrors;

  std::vector<std::string>::const_iterator itFilename = fileNames.begin();  
  while(itFilename != fileNames.end())
    {
    hasError = false;

    // Read the header file
    std::ifstream file;
    file.open((*itFilename).c_str(), std::ios::binary | std::ios::in);
    if(!file.is_open())
      {
      std::cout << "Cannot open header file: " << (*itFilename).c_str() << std::endl;
      return false;
      }

    file.seekg(0,std::ios::end);
    unsigned long fileSize = file.tellg();
    file.seekg(0,std::ios::beg);

    char* buf = new char[fileSize+1];
    file.read(buf,fileSize);
    buf[fileSize] = 0;
    std::string buffer(buf);
    buffer.resize(fileSize);
    file.close();
    delete [] buf;

    this->ConvertBufferToWindowsFileType(buffer);
    
    ErrorVectorType  tempErrorVector;

    // Check the file char by char
    std::string::const_iterator ith = buffer.begin();
    std::string::const_iterator it = m_Buffer.begin();

    unsigned int pos = 0;
    unsigned int posh = 0;
    long line = -1;


    while((ith != buffer.end()) && (it != m_Buffer.end()))
      {
      // if we have cvs
      if((*ith == '$') && useCVS)
        {
        ith++;
        posh++;
        it++;
        pos++;
        while(((*ith) != '$') && (ith != buffer.end()))
          {
          ith++;
          posh++;
          }
        while(((*it) != '$') && (it != m_Buffer.end()))
          {
          pos++;
          it++;
          }
        //continue;
        }
       
      if((*it) != (*ith))
        {
        // Check if we have a <NA> tag
        if((*ith) == '<')
          {
          auto pos2 = static_cast<long int>(buffer.find("<NA>", posh));
          auto pos3 = static_cast<long int>(buffer.find("<NA>\n", posh));

          // We skip the line
          if(pos3 == static_cast<long int>(posh))
            {
            while(((*ith) != '\n') && (ith != buffer.end()))
              {
              ith++;
              posh++;
              }
            while(((*it) != '\n') && (it != m_Buffer.end()))
              {
              pos++;
              it++;
              }
            continue;
            }
          // if we have the tag we skip the word
          else if(pos2 == static_cast<long int>(posh))
            {
            while(((*ith) != ' ') && (ith != buffer.end()))
              {
              ith++;
              posh++;
              }
            while(((*it) != ' ') && (it != m_Buffer.end()))
              {
              pos++;
              it++;
              }
            continue;
            }
          }
        // if we should not check the spaces at the end of line
        else if( (!considerSpaceEOL)
          && ((*ith == ' ') || (*it == ' '))
          )
          {
          // search if we are effectively at the end of the line
          bool isAtEnd = true;
          if(*it == ' ')
            {
            std::string::const_iterator ittemp = it;
            while((ittemp != m_Buffer.end()) && ((*ittemp) != '\n'))
              {
              if(*ittemp != ' ')
                {
                isAtEnd = false;
                break;
                }
              ittemp++;
              }
            }
          else if(*ith == ' ')
            {
            std::string::const_iterator ittemp = ith;
            while((ittemp != buffer.end()) && ((*ittemp) != '\n'))
              {
              if(*ittemp != ' ')
                {
                isAtEnd = false;
                break;
                }
              ittemp++;
              }
            }

          // If we are at the end we skip the line
          if(!isAtEnd)
            {
            while((ith != buffer.end()) && ((*ith) != '\n'))
              {
              ith++;
              posh++;
              }
            while((it != m_Buffer.end()) && ((*it) != '\n'))
              {
              pos++;
              it++;
              }
            continue;
            }
          }

        // Report the error
        //hasError = true;

        // We report the wrong word and the line
        long l = this->GetLineNumber(pos);
        if(l != line)
          {
          line = l;
          // Find the word
          auto poshw = static_cast<long int>(buffer.find(' ', posh));
          auto poshw2 = static_cast<long int>(buffer.find('\n', posh));
          std::string wordh = "";
          if(poshw!= -1 && poshw < poshw2)
            {
            wordh = buffer.substr(posh,poshw-posh);
            }
          else if (poshw2 != -1)
            {
            wordh = buffer.substr(posh,poshw2-posh-1);
            }

          // Find the word
            auto posw = static_cast<long int>(m_Buffer.find(' ', pos));
            auto posw2 = static_cast<long int>(m_Buffer.find('\n', pos));
            std::string word = "";
            if (posw != -1 && posw < posw2) {
              word = m_Buffer.substr(pos, posw - pos);
            }
          else if (poshw2 != -1)
            {
            word = m_Buffer.substr(pos,posw2-pos-1);
            }

          if(word == wordh)
            {
            wordh = "wrong ident";
            }
         
          if(word == " ")
            {
            word = "[space]";
            }
          if(wordh == " ")
            {
            wordh = "[space]";
            }
         if(word == "\r")
            {
            word = "[end of line]";
            }
          if(wordh == "\r")
            {
            wordh = "[end of line]";
            }
          
          if(word[0] == 0)
            {
            word = "[no char]";
            }
          if(wordh[0] == 0)
            {
            wordh = "[no char]";
            }

          Error error;
          error.line = line;
          error.line2 = error.line;
          error.number = HEADER;
          error.description = "Header mismatch: ";
          error.description += word;
          error.description += " (";
          error.description += wordh;
          error.description += ") : ";
          error.description += headerFilename.c_str();
          tempErrorVector.push_back(error);
          hasError = true;

          // We skip that line   
          while((ith != buffer.end()) && ((*ith) != '\n'))
            {
            ith++;
            posh++;
            }
          while((it != m_Buffer.end()) && ((*it) != '\n'))
            {
            pos++;
            it++;
            }
          }
        }

      if(ith != buffer.end())
        {
        posh++;
        ith++;
        }

      if(it != m_Buffer.end())
        {
        pos++;
        it++;
        }
      }

    if(it == m_Buffer.end())
      {
      Error error;
      error.line = 1;
      error.line2 = error.line;
      error.number = HEADER;
      error.description = "The header is incomplete";
      tempErrorVector.push_back(error);
      hasError = true;
      }

    // If we don't have any errors we return the current errors
    if(!hasError)
      {
      m_HeaderFilename = *itFilename;
      ErrorVectorType::const_iterator itErr = tempErrorVector.begin();
      while(itErr != tempErrorVector.end())
        {
        m_ErrorList.push_back(*itErr);
        itErr++;
        }
      return true;
      }

    tempErrors.push_back(tempErrorVector);

    itFilename++;
    } // end loop of filenames

  // We check the less errors we can have
  unsigned int header=0;
  int minErrors = 9999999;
  unsigned int i=0;
  std::vector<ErrorVectorType>::const_iterator itErrV = tempErrors.begin();
  while(itErrV != tempErrors.end())
    {
    if((int)(*itErrV).size() < minErrors)
      {
      header = i;
      minErrors = static_cast<int>((*itErrV).size());
      }
    i++;
    itErrV++;
    }
 
  ErrorVectorType::const_iterator itErr = tempErrors[header].begin();
  while(itErr != tempErrors[header].end())
    {
    m_ErrorList.push_back(*itErr);
    itErr++;
    }

  m_HeaderFilename = fileNames[header];
  return !hasError;
}